

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

int __thiscall
djb::fresnel::schlick::clone
          (schlick *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  size_t sVar1;
  float *__src;
  undefined8 *puVar2;
  void *__dest;
  ulong __n;
  
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = &PTR_clone_001ffc40;
  sVar1 = (this->f0)._M_size;
  puVar2[1] = sVar1;
  __n = sVar1 << 2;
  __dest = operator_new(__n);
  puVar2[2] = __dest;
  __src = (this->f0)._M_data;
  if (__src != (float *)0x0) {
    memcpy(__dest,__src,__n);
  }
  return (int)puVar2;
}

Assistant:

impl *clone() const {return new schlick(*this);}